

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

shared_ptr<chatra::Node> chatra::parseAsLiteral(ParserContext *ct,Token *token)

{
  string *str;
  char *pcVar1;
  char cVar2;
  TokenType TVar3;
  StringId SVar4;
  int iVar5;
  pointer pcVar6;
  size_type sVar7;
  undefined1 __nptr [8];
  undefined8 ct_00;
  bool bVar8;
  pointer __p;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  long *plVar12;
  uint64_t uVar13;
  IErrorReceiver *pIVar14;
  element_type *extraout_RAX;
  undefined8 *puVar15;
  long *plVar16;
  pointer pbVar17;
  Token *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  size_t in_R8;
  shared_ptr<chatra::Node> sVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  pointer local_100;
  size_type __dnew;
  pointer *local_e8;
  pointer local_e0;
  pointer local_d8 [3];
  pointer local_c0;
  double local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ParserContext *local_90;
  undefined1 auStack_88 [8];
  size_type __dnew_1;
  undefined8 local_78;
  undefined8 uStack_70;
  allocator_type local_61;
  undefined1 local_60 [8];
  string targetStr;
  
  str = &in_RDX->literal;
  targetStr.field_2._8_8_ = token;
  __p = (pointer)operator_new(0x30);
  ct_00 = targetStr.field_2._8_8_;
  (__p->vString)._M_dataplus._M_p = (pointer)0x0;
  (__p->vString)._M_string_length = 0;
  (__p->vString).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->vString).field_2 + 8) = 0;
  *(undefined8 *)__p = 0;
  (__p->field_1).vInt = 0;
  (__p->vString)._M_dataplus._M_p = (pointer)&(__p->vString).field_2;
  (__p->vString).field_2._M_local_buf[0] = '\0';
  TVar3 = in_RDX->type;
  local_c0 = __p;
  if (TVar3 != String) {
    if (TVar3 == Name) {
      SVar4 = in_RDX->sid;
      if (SVar4 == Null) {
        __p->type = Null;
      }
      else {
        __p->type = Bool;
        if (1 < SVar4 - True) {
          auStack_88 = (undefined1  [8])0x18;
          local_60 = (undefined1  [8])&targetStr._M_string_length;
          local_60 = (undefined1  [8])
                     std::__cxx11::string::_M_create((ulong *)local_60,(ulong)auStack_88);
          targetStr._M_string_length = (size_type)auStack_88;
          *(undefined8 *)local_60 = 0x2064696c61766e69;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)local_60 + 8))->_M_allocated_capacity = 0x206e61656c6f6f62;
          pcVar1 = (char *)((long)local_60 + 0x10);
          pcVar1[0] = 'c';
          pcVar1[1] = 'o';
          pcVar1[2] = 'n';
          pcVar1[3] = 's';
          pcVar1[4] = 't';
          pcVar1[5] = 'a';
          pcVar1[6] = 'n';
          pcVar1[7] = 't';
          targetStr._M_dataplus._M_p = (pointer)auStack_88;
          *(char *)((long)local_60 + (long)auStack_88) = '\0';
          auStack_88 = (undefined1  [8])0x0;
          __dnew_1 = 0;
          local_78 = (pointer)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)targetStr.field_2._8_8_,Error,in_RDX,(string *)local_60,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
            operator_delete((void *)local_60);
          }
        }
        (__p->field_1).vBool = SVar4 == True;
      }
      goto LAB_0019e13d;
    }
    if (TVar3 != Number) {
      local_60 = (undefined1  [8])&targetStr._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"internal error","");
      auStack_88 = (undefined1  [8])0x0;
      __dnew_1 = 0;
      local_78 = (pointer)0x0;
      ParserContext::errorAtToken
                ((ParserContext *)targetStr.field_2._8_8_,Error,in_RDX,(string *)local_60,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_88);
      if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
        operator_delete((void *)local_60);
      }
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = &PTR__exception_00243470;
      __cxa_throw(puVar15,&AbortCompilingException::typeinfo,std::exception::~exception);
    }
    if ((in_RDX->literal)._M_string_length < 2) {
LAB_0019dc0a:
      lVar9 = std::__cxx11::string::find((char)str,0x2e);
      if (lVar9 != -1) {
        __p->type = Float;
        pcVar6 = (in_RDX->literal)._M_dataplus._M_p;
        local_60 = (undefined1  [8])&targetStr._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,pcVar6,pcVar6 + (in_RDX->literal)._M_string_length);
        while (uVar10 = std::__cxx11::string::find((char)local_60,0x5f), __nptr = local_60,
              uVar10 != 0xffffffffffffffff) {
          std::__cxx11::string::erase((ulong)local_60,uVar10);
        }
        local_90 = ct;
        piVar11 = __errno_location();
        iVar5 = *piVar11;
        *piVar11 = 0;
        local_b8 = strtod((char *)__nptr,(char **)auStack_88);
        ct = local_90;
        if (auStack_88 == __nptr) {
          std::__throw_invalid_argument("stod");
LAB_0019e2b0:
          std::__throw_out_of_range("stod");
        }
        if (*piVar11 == 0x22) goto LAB_0019e2b0;
        if (*piVar11 == 0) {
          *piVar11 = iVar5;
        }
        if ((pointer)((long)auStack_88 + -(long)__nptr) < targetStr._M_dataplus._M_p) {
          local_100 = (pointer)0x16;
          local_e8 = local_d8;
          local_e8 = (pointer *)
                     std::__cxx11::string::_M_create
                               ((ulong *)&local_e8,(ulong)&stack0xffffffffffffff00);
          local_d8[0] = local_100;
          *local_e8 = (pointer)0x2064696c61766e69;
          local_e8[1] = (pointer)0x7b24207469676964;
          builtin_strncpy((char *)((long)local_e8 + 0xe),"${0} in ",8);
          local_e0 = local_100;
          *(char *)((long)local_e8 + (long)local_100) = '\0';
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_b0 = &local_a0;
          plVar16 = plVar12 + 2;
          if ((long *)*plVar12 == plVar16) {
            local_a0 = *plVar16;
            lStack_98 = plVar12[3];
          }
          else {
            local_a0 = *plVar16;
            local_b0 = (long *)*plVar12;
          }
          local_a8 = plVar12[1];
          *plVar12 = (long)plVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
          pbVar17 = (pointer)(plVar12 + 2);
          if ((pointer)*plVar12 == pbVar17) {
            local_78 = (pbVar17->_M_dataplus)._M_p;
            uStack_70 = plVar12[3];
            auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
          }
          else {
            local_78 = (pbVar17->_M_dataplus)._M_p;
            auStack_88 = (undefined1  [8])*plVar12;
          }
          __dnew_1 = plVar12[1];
          *plVar12 = (long)pbVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::substr((ulong)&local_128,(ulong)local_60);
          __l._M_len = 1;
          __l._M_array = &local_128;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff00,__l,&local_61);
          ParserContext::errorAtToken
                    ((ParserContext *)targetStr.field_2._8_8_,Error,in_RDX,(string *)auStack_88,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffff00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffff00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
            operator_delete((void *)auStack_88);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8);
          }
          local_b8 = 0.0;
        }
        if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
          operator_delete((void *)local_60);
        }
        (local_c0->field_1).vInt = (uint64_t)local_b8;
        __p = local_c0;
        goto LAB_0019e13d;
      }
      __p->type = Int;
      uVar13 = parseIntLiteral((ParserContext *)ct_00,in_RDX,str,0,"decimal",10);
    }
    else if (*(short *)(str->_M_dataplus)._M_p == 0x7830) {
      __p->type = Int;
      uVar13 = parseIntLiteral((ParserContext *)targetStr.field_2._8_8_,in_RDX,str,2,"hexadecimal",
                               0x10);
    }
    else {
      if (*(short *)(str->_M_dataplus)._M_p != 0x6230) goto LAB_0019dc0a;
      __p->type = Int;
      uVar13 = parseIntLiteral((ParserContext *)targetStr.field_2._8_8_,in_RDX,str,2,"binary",2);
    }
    (__p->field_1).vInt = uVar13;
    goto LAB_0019e13d;
  }
  __p->type = String;
  sVar7 = (in_RDX->literal)._M_string_length;
  if (sVar7 == 0) {
LAB_0019deca:
    bVar8 = startsWith(str,0,"r\"");
    index = extraout_RDX_00;
    if (bVar8) {
LAB_0019dedf:
      parseRegexpStringLiteral((string *)local_60,str,index);
    }
    else {
      bVar8 = startsWith(str,0,"R<<<\n");
      if (!bVar8) goto LAB_0019e13d;
      parseRawStringLiteral
                ((string *)local_60,(ParserContext *)targetStr.field_2._8_8_,in_RDX,str,in_R8);
    }
  }
  else {
    cVar2 = *(str->_M_dataplus)._M_p;
    if ((cVar2 != '\'') && (cVar2 != '\"')) {
      if (sVar7 == 1) goto LAB_0019deca;
      if ((*(short *)(str->_M_dataplus)._M_p == 0x274c) ||
         (*(short *)(str->_M_dataplus)._M_p == 0x224c)) {
        __p->type = MultilingualString;
        parseStringLiteral((string *)local_60,(ParserContext *)targetStr.field_2._8_8_,in_RDX,str,1)
        ;
        goto LAB_0019e11c;
      }
      index = extraout_RDX;
      if (*(short *)(str->_M_dataplus)._M_p != 0x2772) goto LAB_0019deca;
      goto LAB_0019dedf;
    }
    parseStringLiteral((string *)local_60,(ParserContext *)targetStr.field_2._8_8_,in_RDX,str,0);
  }
LAB_0019e11c:
  std::__cxx11::string::operator=((string *)&__p->vString,(string *)local_60);
  if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
    operator_delete((void *)local_60);
  }
LAB_0019e13d:
  pIVar14 = (IErrorReceiver *)operator_new(0xd0);
  pIVar14[1]._vptr_IErrorReceiver = (_func_int **)0x100000001;
  pIVar14->_vptr_IErrorReceiver = (_func_int **)&PTR___Sp_counted_ptr_inplace_00243c38;
  pIVar14[8]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[9]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[2]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[3]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[4]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[5]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[6]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[7]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[10]._vptr_IErrorReceiver = (_func_int **)0x0;
  *(undefined4 *)((long)&pIVar14[8]._vptr_IErrorReceiver + 4) = 0xffffffff;
  *(undefined1 *)&pIVar14[10]._vptr_IErrorReceiver = 0xff;
  *(undefined8 *)((long)&pIVar14[0xc]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0xd]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0xe]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0xf]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x10]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x11]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x12]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x13]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x14]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x15]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x16]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0x17]._vptr_IErrorReceiver + 4) = 0;
  pIVar14[0x18]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar14[0x19]._vptr_IErrorReceiver = (_func_int **)0x0;
  *(undefined8 *)((long)&pIVar14[10]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar14[0xb]._vptr_IErrorReceiver + 4) = 0;
  ct->errorReceiver = pIVar14;
  ct->ws = (ParserWorkingSet *)(pIVar14 + 2);
  *(undefined1 *)&pIVar14[2]._vptr_IErrorReceiver = 0x1a;
  std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
  _M_realloc_insert<chatra::Token_const*>
            ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)(pIVar14 + 5),
             (iterator)0x0,(Token **)local_60);
  std::__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>::reset
            ((__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_> *)
             (pIVar14 + 9),__p);
  sVar18.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_01._M_pi;
  sVar18.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RAX;
  return (shared_ptr<chatra::Node>)
         sVar18.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseAsLiteral(ParserContext& ct, const Token& token) {
	auto& t = token.literal;

	std::unique_ptr<Literal> value(new Literal());

	if (token.type == TokenType::Number) {
		if (startsWith(t, 0, "0x")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "hexadecimal", 16);
		}
		else if (startsWith(t, 0, "0b")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "binary", 2);
		}
		else if (t.find('.') != std::string::npos) {
			value->type = LiteralType::Float;
			value->vFloat = parseFloatLiteral(ct, token, t, 0);
		}
		else {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 0, "decimal", 10);
		}
	}
	else if (token.type == TokenType::Name) {
		if (token.sid == StringId::Null)
			value->type = LiteralType::Null;
		else {
			value->type = LiteralType::Bool;
			value->vBool = parseBooleanLiteral(ct, token, token.sid);
		}
	}
	else if (token.type == TokenType::String) {
		value->type = LiteralType::String;
		if (startsWith(t, 0, "'") || startsWith(t, 0, "\""))
			 value->vString = parseStringLiteral(ct, token, t, 0);
		else if (startsWith(t, 0, "L'") || startsWith(t, 0, "L\"")) {
			value->type = LiteralType ::MultilingualString;
			value->vString = parseStringLiteral(ct, token, t, 1);
		}
		else if (startsWith(t, 0, "r'") || startsWith(t, 0, "r\""))
			value->vString = parseRegexpStringLiteral(t, 1);
		else if (startsWith(t, 0, "R<<<\n"))
			value->vString = parseRawStringLiteral(ct, token, t, 5);
	}
	else {
		ct.errorAtToken(ErrorLevel::Error, token, "internal error", {});
		throw AbortCompilingException();
	}

	std::shared_ptr<Node> n = std::make_shared<Node>();
	n->type = NodeType::Literal;
	n->tokens.push_back(&token);
	n->literalValue = std::move(value);
	return n;
}